

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NavMoveRequestTryWrapping(ImGuiWindow *window,ImGuiNavMoveFlags move_flags)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiContext *g;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->NavWindow;
  if (((((pIVar1 == window) && (GImGui->NavMoveRequest == true)) &&
       ((GImGui->NavMoveResultLocal).ID == 0)) &&
      (((GImGui->NavMoveResultOther).ID == 0 &&
       (GImGui->NavMoveRequestForward == ImGuiNavForward_None)))) &&
     (GImGui->NavLayer == ImGuiNavLayer_Main)) {
    fVar6 = window->NavRectRel[0].Min.x;
    fVar9 = window->NavRectRel[0].Min.y;
    fVar7 = window->NavRectRel[0].Max.x;
    fVar8 = window->NavRectRel[0].Max.y;
    uVar5 = GImGui->NavMoveDir;
    uVar4 = uVar5;
    if (uVar5 == 0) {
      if ((move_flags & 5U) == 0) {
        uVar4 = 0;
      }
      else {
        fVar6 = (window->SizeFull).x;
        fVar7 = (window->SizeContents).x;
        uVar4 = -(uint)(fVar7 <= fVar6);
        fVar6 = (float)(~uVar4 & (uint)fVar7 | (uint)fVar6 & uVar4) - (window->Scroll).x;
        if ((move_flags & 4U) != 0) {
          fVar7 = fVar8 - fVar9;
          fVar9 = fVar9 - fVar7;
          fVar8 = fVar8 - fVar7;
        }
        uVar4 = (move_flags & 4U) >> 1;
        GImGui->NavMoveRequest = false;
        pIVar2->NavAnyRequest = pIVar2->NavInitRequest;
        pIVar2->NavMoveClipDir = uVar4;
        pIVar2->NavMoveRequestForward = ImGuiNavForward_ForwardQueued;
        pIVar2->NavMoveRequestFlags = move_flags;
        pIVar1->NavRectRel[0].Min.x = fVar6;
        pIVar1->NavRectRel[0].Min.y = fVar9;
        pIVar1->NavRectRel[0].Max.x = fVar6;
        pIVar1->NavRectRel[0].Max.y = fVar8;
        fVar7 = fVar6;
      }
    }
    if ((move_flags & 5U) != 0 && uVar5 == 1) {
      fVar6 = -(window->Scroll).x;
      if ((move_flags & 4U) != 0) {
        fVar7 = fVar8 - fVar9;
        fVar9 = fVar9 + fVar7;
        fVar8 = fVar8 + fVar7;
        uVar4 = 3;
      }
      pIVar2->NavMoveRequest = false;
      pIVar2->NavAnyRequest = pIVar2->NavInitRequest;
      pIVar2->NavMoveClipDir = uVar4;
      pIVar2->NavMoveRequestForward = ImGuiNavForward_ForwardQueued;
      pIVar2->NavMoveRequestFlags = move_flags;
      pIVar1->NavRectRel[0].Min.x = fVar6;
      pIVar1->NavRectRel[0].Min.y = fVar9;
      pIVar1->NavRectRel[0].Max.x = fVar6;
      pIVar1->NavRectRel[0].Max.y = fVar8;
      fVar7 = fVar6;
    }
    if (((move_flags & 10U) != 0) && (pIVar2->NavMoveDir == 2)) {
      fVar9 = (window->SizeFull).y;
      fVar8 = (window->SizeContents).y;
      uVar5 = -(uint)(fVar8 <= fVar9);
      fVar9 = (float)(~uVar5 & (uint)fVar8 | (uint)fVar9 & uVar5) - (window->Scroll).y;
      bVar3 = (move_flags & 8U) != 0;
      if (bVar3) {
        fVar8 = fVar7 - fVar6;
        fVar6 = fVar6 - fVar8;
        fVar7 = fVar7 - fVar8;
      }
      if (bVar3) {
        uVar4 = 0;
      }
      pIVar2->NavMoveRequest = false;
      pIVar2->NavAnyRequest = pIVar2->NavInitRequest;
      pIVar2->NavMoveClipDir = uVar4;
      pIVar2->NavMoveRequestForward = ImGuiNavForward_ForwardQueued;
      pIVar2->NavMoveRequestFlags = move_flags;
      pIVar1->NavRectRel[0].Min.x = fVar6;
      pIVar1->NavRectRel[0].Min.y = fVar9;
      pIVar1->NavRectRel[0].Max.x = fVar7;
      pIVar1->NavRectRel[0].Max.y = fVar9;
    }
    if (((move_flags & 10U) != 0) && (pIVar2->NavMoveDir == 3)) {
      fVar9 = -(window->Scroll).y;
      bVar3 = (move_flags & 8U) != 0;
      if (bVar3) {
        fVar8 = fVar7 - fVar6;
        fVar6 = fVar6 + fVar8;
        fVar7 = fVar7 + fVar8;
      }
      if (bVar3) {
        uVar4 = 1;
      }
      pIVar2->NavMoveRequest = false;
      pIVar2->NavAnyRequest = pIVar2->NavInitRequest;
      pIVar2->NavMoveClipDir = uVar4;
      pIVar2->NavMoveRequestForward = ImGuiNavForward_ForwardQueued;
      pIVar2->NavMoveRequestFlags = move_flags;
      pIVar1->NavRectRel[0].Min.x = fVar6;
      pIVar1->NavRectRel[0].Min.y = fVar9;
      pIVar1->NavRectRel[0].Max.x = fVar7;
      pIVar1->NavRectRel[0].Max.y = fVar9;
      return;
    }
  }
  return;
}

Assistant:

void ImGui::NavMoveRequestTryWrapping(ImGuiWindow* window, ImGuiNavMoveFlags move_flags)
{
    ImGuiContext& g = *GImGui;
    if (g.NavWindow != window || !NavMoveRequestButNoResultYet() || g.NavMoveRequestForward != ImGuiNavForward_None || g.NavLayer != 0)
        return;
    IM_ASSERT(move_flags != 0); // No points calling this with no wrapping
    ImRect bb_rel = window->NavRectRel[0];

    ImGuiDir clip_dir = g.NavMoveDir;
    if (g.NavMoveDir == ImGuiDir_Left && (move_flags & (ImGuiNavMoveFlags_WrapX | ImGuiNavMoveFlags_LoopX)))
    {
        bb_rel.Min.x = bb_rel.Max.x = ImMax(window->SizeFull.x, window->SizeContents.x) - window->Scroll.x;
        if (move_flags & ImGuiNavMoveFlags_WrapX) { bb_rel.TranslateY(-bb_rel.GetHeight()); clip_dir = ImGuiDir_Up; }
        NavMoveRequestForward(g.NavMoveDir, clip_dir, bb_rel, move_flags);
    }
    if (g.NavMoveDir == ImGuiDir_Right && (move_flags & (ImGuiNavMoveFlags_WrapX | ImGuiNavMoveFlags_LoopX)))
    {
        bb_rel.Min.x = bb_rel.Max.x = -window->Scroll.x;
        if (move_flags & ImGuiNavMoveFlags_WrapX) { bb_rel.TranslateY(+bb_rel.GetHeight()); clip_dir = ImGuiDir_Down; }
        NavMoveRequestForward(g.NavMoveDir, clip_dir, bb_rel, move_flags);
    }
    if (g.NavMoveDir == ImGuiDir_Up && (move_flags & (ImGuiNavMoveFlags_WrapY | ImGuiNavMoveFlags_LoopY)))
    {
        bb_rel.Min.y = bb_rel.Max.y = ImMax(window->SizeFull.y, window->SizeContents.y) - window->Scroll.y;
        if (move_flags & ImGuiNavMoveFlags_WrapY) { bb_rel.TranslateX(-bb_rel.GetWidth()); clip_dir = ImGuiDir_Left; }
        NavMoveRequestForward(g.NavMoveDir, clip_dir, bb_rel, move_flags);
    }
    if (g.NavMoveDir == ImGuiDir_Down && (move_flags & (ImGuiNavMoveFlags_WrapY | ImGuiNavMoveFlags_LoopY)))
    {
        bb_rel.Min.y = bb_rel.Max.y = -window->Scroll.y;
        if (move_flags & ImGuiNavMoveFlags_WrapY) { bb_rel.TranslateX(+bb_rel.GetWidth()); clip_dir = ImGuiDir_Right; }
        NavMoveRequestForward(g.NavMoveDir, clip_dir, bb_rel, move_flags);
    }
}